

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall
diligent_spirv_cross::CompilerGLSL::to_storage_qualifiers_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  bool is_inout;
  uint32_t loc;
  SPIREntryPoint *execution;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  bVar1 = subpass_input_is_framebuffer_fetch(this,uVar2);
  if (bVar1) {
    this_local = (CompilerGLSL *)0xe30c4c;
  }
  else if ((var->storage == Input) || (var->storage == Output)) {
    bVar1 = is_legacy(this);
    if ((bVar1) && (pSVar3->model == ExecutionModelVertex)) {
      this_local = (CompilerGLSL *)"varying ";
      if (var->storage == Input) {
        this_local = (CompilerGLSL *)"attribute ";
      }
    }
    else {
      bVar1 = is_legacy(this);
      if ((bVar1) && (pSVar3->model == ExecutionModelFragment)) {
        this_local = (CompilerGLSL *)anon_var_dwarf_27672fb;
      }
      else if ((pSVar3->model == ExecutionModelFragment) && (var->storage == Output)) {
        uVar2 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                           DecorationLocation);
        bVar1 = location_is_framebuffer_fetch(this,uVar2);
        if (bVar1) {
          this_local = (CompilerGLSL *)anon_var_dwarf_c0c552;
        }
        else {
          this_local = (CompilerGLSL *)0xec4dbc;
        }
      }
      else {
        this_local = (CompilerGLSL *)0xec4dbc;
        if (var->storage == Input) {
          this_local = (CompilerGLSL *)0xe6e98f;
        }
      }
    }
  }
  else if ((((var->storage == StorageClassUniformConstant) || (var->storage == StorageClassUniform))
           || (var->storage == PushConstant)) || (var->storage == AtomicCounter)) {
    this_local = (CompilerGLSL *)0xe61fc5;
  }
  else if (var->storage == RayPayloadKHR) {
    this_local = (CompilerGLSL *)"rayPayloadNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"rayPayloadEXT ";
    }
  }
  else if (var->storage == IncomingRayPayloadKHR) {
    this_local = (CompilerGLSL *)"rayPayloadInNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"rayPayloadInEXT ";
    }
  }
  else if (var->storage == HitAttributeKHR) {
    this_local = (CompilerGLSL *)"hitAttributeNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"hitAttributeEXT ";
    }
  }
  else if (var->storage == CallableDataKHR) {
    this_local = (CompilerGLSL *)"callableDataNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"callableDataEXT ";
    }
  }
  else if (var->storage == IncomingCallableDataKHR) {
    this_local = (CompilerGLSL *)"callableDataInNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"callableDataInEXT ";
    }
  }
  else {
    this_local = (CompilerGLSL *)0xe30c4c;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
	{
		if (is_legacy() && execution.model == ExecutionModelVertex)
			return var.storage == StorageClassInput ? "attribute " : "varying ";
		else if (is_legacy() && execution.model == ExecutionModelFragment)
			return "varying "; // Fragment outputs are renamed so they never hit this case.
		else if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
		{
			uint32_t loc = get_decoration(var.self, DecorationLocation);
			bool is_inout = location_is_framebuffer_fetch(loc);
			if (is_inout)
				return "inout ";
			else
				return "out ";
		}
		else
			return var.storage == StorageClassInput ? "in " : "out ";
	}
	else if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	         var.storage == StorageClassPushConstant || var.storage == StorageClassAtomicCounter)
	{
		return "uniform ";
	}
	else if (var.storage == StorageClassRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadEXT " : "rayPayloadNV ";
	}
	else if (var.storage == StorageClassIncomingRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadInEXT " : "rayPayloadInNV ";
	}
	else if (var.storage == StorageClassHitAttributeKHR)
	{
		return ray_tracing_is_khr ? "hitAttributeEXT " : "hitAttributeNV ";
	}
	else if (var.storage == StorageClassCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataEXT " : "callableDataNV ";
	}
	else if (var.storage == StorageClassIncomingCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataInEXT " : "callableDataInNV ";
	}

	return "";
}